

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool __thiscall MeCab::FeatureIndex::openTemplate(FeatureIndex *this,Param *param)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  iterator iVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  _Alloc_hider __s1;
  int iVar7;
  ostream *poVar8;
  byte *__s;
  long *plVar9;
  size_t sVar10;
  byte *pbVar11;
  ulong uVar12;
  string *psVar13;
  byte *pbVar14;
  byte *pbVar15;
  long lVar16;
  bool bVar17;
  string filename;
  char *column [4];
  ifstream ifs;
  string local_2f8;
  string local_2d8;
  string local_2b0;
  vector<char_const*,std::allocator<char_const*>> *local_290;
  Param *local_288;
  vector<char_const*,std::allocator<char_const*>> *local_280;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  byte abStack_218 [488];
  
  Param::get<std::__cxx11::string>(&local_238,param,"dicdir");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"feature.def","");
  create_filename(&local_2f8,&local_238,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  std::ifstream::ifstream(&local_238,local_2f8._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"ifs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"no such file or directory: ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
    die::~die((die *)&local_2d8);
  }
  __s = (byte *)operator_new__(0x2000);
  ppcVar2 = (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar2) {
    (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar2;
  }
  ppcVar2 = (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppcVar2) {
    (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar2;
  }
  local_280 = (vector<char_const*,std::allocator<char_const*>> *)&this->unigram_templs_;
  local_290 = (vector<char_const*,std::allocator<char_const*>> *)&this->bigram_templs_;
  local_288 = param;
  do {
    do {
      std::ios::widen((char)*(undefined8 *)(local_238._M_dataplus._M_p + -0x18) + (char)&local_238);
      plVar9 = (long *)std::istream::getline((char *)&local_238,(long)__s,'\0');
      if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
        Param::get<std::__cxx11::string>(&local_258,local_288,"dicdir");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"rewrite.def","");
        create_filename(&local_2b0,&local_258,&local_278);
        std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        DictionaryRewriter::open(&this->rewrite_,local_2f8._M_dataplus._M_p,0);
        operator_delete__(__s);
        std::ifstream::~ifstream(&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p);
        }
        return true;
      }
    } while (((ulong)*__s < 0x24) && ((0x900000001U >> ((ulong)*__s & 0x3f) & 1) != 0));
    sVar10 = strlen((char *)__s);
    pbVar11 = __s + sVar10;
    psVar13 = &local_2d8;
    uVar12 = 0;
    pbVar14 = __s;
    do {
      pbVar5 = pbVar11;
      pbVar6 = pbVar14;
      if (1 < uVar12) break;
      for (; pbVar15 = pbVar11, pbVar6 != pbVar11; pbVar6 = pbVar6 + 1) {
        if (*pbVar6 != 9) {
          lVar16 = 0;
          do {
            bVar17 = lVar16 == 1;
            pbVar15 = pbVar5;
            if (bVar17) goto LAB_0013e1e3;
            lVar4 = lVar16 + 1;
            lVar16 = lVar16 + 1;
          } while (*pbVar6 != "\t "[lVar4]);
        }
        bVar17 = false;
        pbVar15 = pbVar6;
LAB_0013e1e3:
        if (!bVar17) break;
        pbVar5 = pbVar15;
      }
      *pbVar15 = 0;
      if (*pbVar14 != 0) {
        (psVar13->_M_dataplus)._M_p = (pointer)pbVar14;
        psVar13 = (string *)&psVar13->_M_string_length;
        uVar12 = uVar12 + 1;
      }
      pbVar14 = pbVar15 + 1;
    } while (pbVar15 != pbVar11);
    if (uVar12 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"tokenize2(buf.get(), \"\\t \", column, 2) == 2",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
      die::~die((die *)&local_2b0);
    }
    __s1._M_p = local_2d8._M_dataplus._M_p;
    iVar7 = strcmp(local_2d8._M_dataplus._M_p,"UNIGRAM");
    if (iVar7 == 0) {
      local_2b0._M_dataplus._M_p = strdup(this,(char *)local_2d8._M_string_length);
      iVar3._M_current =
           (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  (local_280,iVar3,(char **)&local_2b0);
      }
      else {
        *iVar3._M_current = local_2b0._M_dataplus._M_p;
        pppcVar1 = &(this->unigram_templs_).
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    else {
      iVar7 = strcmp(__s1._M_p,"BIGRAM");
      if (iVar7 == 0) {
        local_2b0._M_dataplus._M_p = strdup(this,(char *)local_2d8._M_string_length);
        iVar3._M_current =
             (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                    (local_290,iVar3,(char **)&local_2b0);
        }
        else {
          *iVar3._M_current = local_2b0._M_dataplus._M_p;
          pppcVar1 = &(this->bigram_templs_).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x65);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"false",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
        die::~die((die *)&local_2b0);
      }
    }
  } while( true );
}

Assistant:

bool FeatureIndex::openTemplate(const Param &param) {
  std::string filename = create_filename(param.get<std::string>("dicdir"),
                                         FEATURE_FILE);
  std::ifstream ifs(WPATH(filename.c_str()));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;

  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[4];

  unigram_templs_.clear();
  bigram_templs_.clear();

  while (ifs.getline(buf.get(), buf.size())) {
    if (buf[0] == '\0' || buf[0] == '#' || buf[0] == ' ') {
      continue;
    }
    CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
        << "format error: " <<filename;

    if (std::strcmp(column[0], "UNIGRAM") == 0) {
      unigram_templs_.push_back(this->strdup(column[1]));
    } else if (std::strcmp(column[0], "BIGRAM") == 0) {
      bigram_templs_.push_back(this->strdup(column[1]));
    } else {
      CHECK_DIE(false) << "format error: " <<  filename;
    }
  }

  // second, open rewrite rules
  filename = create_filename(param.get<std::string>("dicdir"),
                             REWRITE_FILE);
  rewrite_.open(filename.c_str());

  return true;
}